

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Result wabt::interp::Match(TableType *expected,TableType *actual,string *out_msg)

{
  bool bVar1;
  Enum EVar2;
  Enum EVar3;
  Result result;
  undefined8 uVar4;
  ValueType type;
  undefined1 auVar5 [16];
  string local_90;
  interp *local_70;
  string local_68;
  string local_48;
  string *local_28;
  string *out_msg_local;
  TableType *actual_local;
  TableType *expected_local;
  
  local_28 = out_msg;
  out_msg_local = (string *)actual;
  actual_local = expected;
  EVar2 = Type::operator_cast_to_Enum((Type *)&(expected->super_ExternType).field_0xc);
  EVar3 = Type::operator_cast_to_Enum((Type *)((long)&out_msg_local->_M_string_length + 4));
  if (EVar2 == EVar3) {
    result = Match(&actual_local->limits,(Limits *)((long)&out_msg_local->field_2 + 8),local_28);
    bVar1 = Failed(result);
    if (bVar1) {
      Result::Result((Result *)((long)&expected_local + 4),Error);
    }
    else {
      Result::Result((Result *)((long)&expected_local + 4),Ok);
    }
  }
  else {
    local_70 = *(interp **)&(actual_local->super_ExternType).field_0xc;
    GetName_abi_cxx11_(&local_68,local_70,type);
    auVar5 = std::__cxx11::string::c_str();
    GetName_abi_cxx11_(&local_90,*(interp **)((long)&out_msg_local->_M_string_length + 4),
                       auVar5._8_8_);
    uVar4 = std::__cxx11::string::c_str();
    StringPrintf_abi_cxx11_
              (&local_48,"type mismatch in imported table, expected %s but got %s.",auVar5._0_8_,
               uVar4);
    std::__cxx11::string::operator=((string *)local_28,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_68);
    Result::Result((Result *)((long)&expected_local + 4),Error);
  }
  return (Result)expected_local._4_4_;
}

Assistant:

Result Match(const TableType& expected,
             const TableType& actual,
             std::string* out_msg) {
  if (expected.element != actual.element) {
    *out_msg = StringPrintf(
        "type mismatch in imported table, expected %s but got %s.",
        GetName(expected.element).c_str(), GetName(actual.element).c_str());
    return Result::Error;
  }

  if (Failed(Match(expected.limits, actual.limits, out_msg))) {
    return Result::Error;
  }

  return Result::Ok;
}